

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<QAbstractNativeEventFilter_*>::data(QList<QAbstractNativeEventFilter_*> *this)

{
  QArrayDataPointer<QAbstractNativeEventFilter_*> *this_00;
  QAbstractNativeEventFilter **ppQVar1;
  QArrayDataPointer<QAbstractNativeEventFilter_*> *in_RDI;
  
  detach((QList<QAbstractNativeEventFilter_*> *)0x32f9cc);
  this_00 = (QArrayDataPointer<QAbstractNativeEventFilter_*> *)
            QArrayDataPointer<QAbstractNativeEventFilter_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QAbstractNativeEventFilter_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }